

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

parser<pstore::exchange::import_ns::callbacks> * __thiscall
pstore::json::parser<pstore::exchange::import_ns::callbacks>::
input<pstore::gsl::details::span_iterator<pstore::gsl::span<char_const,_1l>,false>>
          (parser<pstore::exchange::import_ns::callbacks> *this,
          span_iterator<pstore::gsl::span<const_char,__1L>,_false> *first,
          span_iterator<pstore::gsl::span<const_char,__1L>,_false> *last)

{
  matcher<pstore::exchange::import_ns::callbacks> *pmVar1;
  _Map_pointer ppuVar2;
  bool bVar3;
  reference ptVar4;
  error_category *peVar5;
  _Elt_pointer puVar6;
  char local_52;
  type local_51;
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>>>
  *local_50;
  unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  local_48;
  char local_38;
  
  if ((this->error_)._M_value == 0) {
    local_50 = (deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>>>
                *)&this->stack_;
    do {
      if ((first->span_ == last->span_) && (first->index_ == last->index_)) {
        return this;
      }
      puVar6 = (this->stack_).c.
               super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (puVar6 == (this->stack_).c.
                    super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        assert_failed("!stack_.empty ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x716);
      }
      if (puVar6 == (this->stack_).c.
                    super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        puVar6 = (this->stack_).c.
                 super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      pmVar1 = puVar6[-1]._M_t.
               super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
               .
               super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
               ._M_head_impl;
      ptVar4 = gsl::details::span_iterator<pstore::gsl::span<const_char,_-1L>,_false>::operator*
                         (first);
      local_52 = '\x01';
      local_51 = *ptVar4;
      (*pmVar1->_vptr_matcher[2])(&local_48,pmVar1,this,&local_52);
      if (local_52 == '\x01') {
        local_52 = '\0';
      }
      if ((puVar6[-1]._M_t.
           super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
          ._M_head_impl)->state_ == 1) {
        if ((this->error_)._M_value == 0) {
          std::
          deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
          ::pop_back((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                      *)local_50);
          goto LAB_00134a9c;
        }
LAB_00134b02:
        bVar3 = false;
      }
      else {
LAB_00134a9c:
        if (local_48._M_t.
            super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
            .
            super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
            ._M_head_impl != (matcher<pstore::exchange::import_ns::callbacks> *)0x0) {
          ppuVar2 = (this->stack_).c.
                    super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
          if (200 < ((long)(this->stack_).c.
                           super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_last -
                     (long)(this->stack_).c.
                           super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                    ((long)(this->stack_).c.
                           super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                     (long)(this->stack_).c.
                           super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                    ((((ulong)((long)ppuVar2 -
                              (long)(this->stack_).c.
                                    super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                    (ulong)(ppuVar2 == (_Map_pointer)0x0)) * 0x20) {
            if ((this->error_)._M_value != 0) {
              assert_failed("!error_",
                            "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                            ,0x724);
            }
            peVar5 = get_error_category();
            (this->error_)._M_value = 0xe;
            (this->error_)._M_cat = peVar5;
            goto LAB_00134b02;
          }
          std::
          deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>>>
          ::
          emplace_back<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>>
                    (local_50,&local_48);
        }
        bVar3 = true;
        if (local_38 == '\x01') {
          gsl::details::span_iterator<pstore::gsl::span<const_char,_-1L>,_false>::operator*(first);
          (this->coordinate_).column = (this->coordinate_).column + 1;
          gsl::details::span_iterator<pstore::gsl::span<const_char,_-1L>,_false>::operator++(first);
        }
      }
      if (local_48._M_t.
          super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
          .
          super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
          ._M_head_impl != (matcher<pstore::exchange::import_ns::callbacks> *)0x0) {
        (*(local_48._M_t.
           super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
          ._M_head_impl)->_vptr_matcher
          [(byte)local_48._M_t.
                 super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                 .
                 super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                 .
                 super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>,_false>
                 ._M_head_impl.delete_])();
      }
    } while (bVar3);
  }
  return this;
}

Assistant:

auto parser<Callbacks>::input (InputIterator first, InputIterator last) -> parser & {
            static_assert (
                std::is_same<typename std::remove_cv<
                                 typename std::iterator_traits<InputIterator>::value_type>::type,
                             char>::value,
                "iterator value_type must be char");
            if (error_) {
                return *this;
            }
            while (first != last) {
                PSTORE_ASSERT (!stack_.empty ());
                auto & handler = stack_.top ();
                auto res = handler->consume (*this, just (*first));
                if (handler->is_done ()) {
                    if (error_) {
                        break;
                    }
                    stack_.pop (); // release the topmost matcher object.
                }

                if (res.first != nullptr) {
                    if (stack_.size () > max_stack_depth_) {
                        // We've already hit the maximum allowed parse stack depth. Reject this new
                        // matcher.
                        PSTORE_ASSERT (!error_);
                        error_ = make_error_code (error_code::nesting_too_deep);
                        break;
                    }

                    stack_.push (std::move (res.first));
                }
                // If we're matching this character, advance the column number and increment the
                // iterator.
                if (res.second) {
                    // Increment the column number if this is _not_ a UTF-8 continuation character.
                    if (utf::is_utf_char_start (*first)) {
                        this->advance_column ();
                    }
                    ++first;
                }
            }
            return *this;
        }